

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,OpType *op)

{
  OpType *op_local;
  string *ss;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  switch(*(undefined4 *)this) {
  case 0:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"xformOp:transform");
    break;
  case 1:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"xformOp:translate");
    break;
  case 2:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"xformOp:scale");
    break;
  case 3:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"xformOp:rotateX");
    break;
  case 4:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"xformOp:rotateY");
    break;
  case 5:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"xformOp:rotateZ");
    break;
  case 6:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"xformOp:rotateXYZ");
    break;
  case 7:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"xformOp:rotateXZY");
    break;
  case 8:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"xformOp:rotateYXZ");
    break;
  case 9:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"xformOp:rotateYZX");
    break;
  case 10:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"xformOp:rotateZXY");
    break;
  case 0xb:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"xformOp:rotateZYX");
    break;
  case 0xc:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"xformOp:orient");
    break;
  case 0xd:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"!resetXformStack!");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const XformOp::OpType &op) {
  std::string ss;

  switch (op) {
    case XformOp::OpType::ResetXformStack: {
      ss = "!resetXformStack!";
      break;
    }
    case XformOp::OpType::Transform: {
      ss = "xformOp:transform";
      break;
    }
    case XformOp::OpType::Translate: {
      ss = "xformOp:translate";
      break;
    }
    case XformOp::OpType::Scale: {
      ss = "xformOp:scale";
      break;
    }
    case XformOp::OpType::RotateX: {
      ss = "xformOp:rotateX";
      break;
    }
    case XformOp::OpType::RotateY: {
      ss = "xformOp:rotateY";
      break;
    }
    case XformOp::OpType::RotateZ: {
      ss = "xformOp:rotateZ";
      break;
    }
    case XformOp::OpType::RotateXYZ: {
      ss = "xformOp:rotateXYZ";
      break;
    }
    case XformOp::OpType::RotateXZY: {
      ss = "xformOp:rotateXZY";
      break;
    }
    case XformOp::OpType::RotateYXZ: {
      ss = "xformOp:rotateYXZ";
      break;
    }
    case XformOp::OpType::RotateYZX: {
      ss = "xformOp:rotateYZX";
      break;
    }
    case XformOp::OpType::RotateZXY: {
      ss = "xformOp:rotateZXY";
      break;
    }
    case XformOp::OpType::RotateZYX: {
      ss = "xformOp:rotateZYX";
      break;
    }
    case XformOp::OpType::Orient: {
      ss = "xformOp:orient";
      break;
    }
  }

  return ss;
}